

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

double dist(Vector3d a,Vector3d b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double dVar6;
  Matrix<double,_3,_1> local_30;
  Matrix<double,_3,_1> local_20;
  
  pdVar5 = Matrix<double,_3,_1>::operator()(&local_20,0,0);
  dVar6 = *pdVar5;
  pdVar5 = Matrix<double,_3,_1>::operator()(&local_30,0,0);
  dVar1 = *pdVar5;
  pdVar5 = Matrix<double,_3,_1>::operator()(&local_20,1,0);
  dVar2 = *pdVar5;
  pdVar5 = Matrix<double,_3,_1>::operator()(&local_30,1,0);
  dVar3 = *pdVar5;
  pdVar5 = Matrix<double,_3,_1>::operator()(&local_20,2,0);
  dVar4 = *pdVar5;
  pdVar5 = Matrix<double,_3,_1>::operator()(&local_30,2,0);
  dVar6 = (dVar4 - *pdVar5) * (dVar4 - *pdVar5) +
          (dVar2 - dVar3) * (dVar2 - dVar3) + (dVar6 - dVar1) * (dVar6 - dVar1);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar6;
}

Assistant:

double dist(const Vector3d a, const Vector3d b)
{
    double X2 = pow((a(0, 0) - b(0, 0)), 2);
    double Y2 = pow((a(1, 0) - b(1, 0)), 2);
    double Z2 = pow((a(2, 0) - b(2, 0)), 2);
    return (sqrt(X2 + Y2 + Z2));
}